

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

wchar_t * archive_entry_hardlink_w(archive_entry *entry)

{
  wchar_t wVar1;
  wchar_t *in_RAX;
  int *piVar2;
  wchar_t *p;
  
  if ((entry->ae_set & L'\x01') != L'\0') {
    p = in_RAX;
    wVar1 = archive_mstring_get_wcs(entry->archive,&entry->ae_linkname,&p);
    if (wVar1 == L'\0') {
      return p;
    }
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t *
archive_entry_hardlink_w(struct archive_entry *entry)
{
	const wchar_t *p;
	if ((entry->ae_set & AE_SET_HARDLINK) == 0)
		return (NULL);
	if (archive_mstring_get_wcs(
	    entry->archive, &entry->ae_linkname, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}